

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material_palette.c
# Opt level: O1

bool_t prf_material_palette_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  bool bVar1;
  uint len;
  bool_t bVar2;
  float32_t *pfVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  
  if (node->opcode == prf_material_palette_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    iVar6 = 4;
    do {
      iVar4 = iVar6 + 4;
      if ((int)(uint)node->length < iVar4) {
        bVar1 = false;
      }
      else {
        pfVar3 = (float32_t *)(node->data + iVar6);
        bf_put_float32_be(bfile,pfVar3[-1]);
        iVar7 = iVar6 + 8;
        if (iVar7 <= (int)(uint)node->length) {
          bf_put_float32_be(bfile,*pfVar3);
          iVar4 = iVar6 + 0xc;
          if ((int)(uint)node->length < iVar4) {
LAB_0010851f:
            bVar1 = false;
            iVar6 = iVar7;
            goto LAB_00108524;
          }
          bf_put_float32_be(bfile,pfVar3[1]);
          iVar7 = iVar6 + 0x10;
          if (iVar7 <= (int)(uint)node->length) {
            bf_put_float32_be(bfile,pfVar3[2]);
            iVar4 = iVar6 + 0x14;
            if ((int)(uint)node->length < iVar4) goto LAB_0010851f;
            bf_put_float32_be(bfile,pfVar3[3]);
            iVar7 = iVar6 + 0x18;
            if (iVar7 <= (int)(uint)node->length) {
              bf_put_float32_be(bfile,pfVar3[4]);
              iVar4 = iVar6 + 0x1c;
              if ((int)(uint)node->length < iVar4) goto LAB_0010851f;
              bf_put_float32_be(bfile,pfVar3[5]);
              iVar7 = iVar6 + 0x20;
              if (iVar7 <= (int)(uint)node->length) {
                bf_put_float32_be(bfile,pfVar3[6]);
                iVar4 = iVar6 + 0x24;
                if ((int)(uint)node->length < iVar4) goto LAB_0010851f;
                bf_put_float32_be(bfile,pfVar3[7]);
                iVar7 = iVar6 + 0x28;
                if (iVar7 <= (int)(uint)node->length) {
                  bf_put_float32_be(bfile,pfVar3[8]);
                  iVar4 = iVar6 + 0x2c;
                  if ((int)(uint)node->length < iVar4) goto LAB_0010851f;
                  bf_put_float32_be(bfile,pfVar3[9]);
                  iVar7 = iVar6 + 0x30;
                  if (iVar7 <= (int)(uint)node->length) {
                    bf_put_float32_be(bfile,pfVar3[10]);
                    iVar4 = iVar6 + 0x34;
                    if ((int)(uint)node->length < iVar4) goto LAB_0010851f;
                    bf_put_float32_be(bfile,pfVar3[0xb]);
                    iVar7 = iVar6 + 0x38;
                    if (iVar7 <= (int)(uint)node->length) {
                      bf_put_float32_be(bfile,pfVar3[0xc]);
                      iVar4 = iVar6 + 0x3c;
                      if ((int)(uint)node->length < iVar4) goto LAB_0010851f;
                      bf_put_uint32_be(bfile,(uint32_t)pfVar3[0xd]);
                      if (iVar6 + 0x40 <= (int)(uint)node->length) {
                        bf_write(bfile,(uint8_t *)(pfVar3 + 0xe),0xc);
                        iVar7 = iVar6 + 0xb8;
                        lVar5 = 0;
                        iVar4 = iVar6 + 0x48;
                        do {
                          bVar1 = true;
                          iVar6 = iVar4;
                          if ((int)(uint)node->length < iVar4 + 4) break;
                          bf_put_uint32_be(bfile,(uint32_t)pfVar3[lVar5 + 0x11]);
                          lVar5 = lVar5 + 1;
                          iVar6 = iVar7;
                          iVar4 = iVar4 + 4;
                        } while (lVar5 != 0x1c);
                        goto LAB_00108524;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        bVar1 = false;
        iVar6 = iVar4;
      }
LAB_00108524:
    } while (bVar1);
    bVar2 = 1;
    len = (uint)node->length - iVar6;
    if (len != 0 && iVar6 <= (int)(uint)node->length) {
      bf_write(bfile,node->data + (long)iVar6 + -4,len);
    }
  }
  else {
    bVar2 = 0;
    prf_error(9,"tried material palette save method on node of type %d.");
  }
  return bVar2;
}

Assistant:

static
bool_t
prf_material_palette_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;
    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_material_palette_info.opcode ) {
        prf_error( 9, "tried material palette save method on node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        int i;
        data = (node_data *) (node->data + pos - 4);
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->ambient_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->ambient_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->ambient_blue ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->diffuse_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->diffuse_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->diffuse_blue ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->specular_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->specular_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->specular_blue ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->emissive_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->emissive_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->emissive_blue ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->shininess ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->alpha ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->flags ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_write( bfile, (uint8_t *) data->name, 12 ); pos += 12;
        for ( i = 0; i < 28 && node->length >= (pos + 4); i++ ) {
            bf_put_uint32_be( bfile, data->reserved1[i] ); pos += 4;
        }
    } while ( TRUE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}